

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

void rngDestroy(void)

{
  mtMtxLock((mt_mtx_t *)0x1299fd);
  blobClose((blob_t)0x129a09);
  _state = (rng_state_st *)0x0;
  _ctr = 0;
  mtMtxUnlock((mt_mtx_t *)0x129a2b);
  mtMtxClose((mt_mtx_t *)0x129a37);
  return;
}

Assistant:

static void rngDestroy()
{
	// закрыть состояние (могли забыть)
	mtMtxLock(_mtx);
	blobClose(_state), _state = 0, _ctr = 0;
	mtMtxUnlock(_mtx);
	// закрыть мьютекс
	mtMtxClose(_mtx);
}